

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cn2Kernel.cpp
# Opt level: O3

void __thiscall
xmrig::Cn2Kernel::setArgs
          (Cn2Kernel *this,cl_mem scratchpads,cl_mem states,
          vector<_cl_mem_*,_std::allocator<_cl_mem_*>_> *branches,uint32_t threads)

{
  pointer pp_Var1;
  ulong uVar2;
  uint32_t index;
  uint32_t local_34;
  cl_mem local_30;
  cl_mem local_28;
  
  local_34 = threads;
  local_30 = states;
  local_28 = scratchpads;
  OclKernel::setArg(&this->super_OclKernel,0,8,&local_28);
  OclKernel::setArg(&this->super_OclKernel,1,8,&local_30);
  OclKernel::setArg(&this->super_OclKernel,6,4,&local_34);
  pp_Var1 = (branches->super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((branches->super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != pp_Var1) {
    index = 2;
    uVar2 = 0;
    do {
      OclKernel::setArg(&this->super_OclKernel,index,8,pp_Var1 + uVar2);
      uVar2 = (ulong)(index - 1);
      pp_Var1 = (branches->super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      index = index + 1;
    } while (uVar2 < (ulong)((long)(branches->
                                   super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3));
  }
  return;
}

Assistant:

void xmrig::Cn2Kernel::setArgs(cl_mem scratchpads, cl_mem states, const std::vector<cl_mem> &branches, uint32_t threads)
{
    setArg(0, sizeof(cl_mem), &scratchpads);
    setArg(1, sizeof(cl_mem), &states);
    setArg(6, sizeof(uint32_t), &threads);

    for (uint32_t i = 0; i < branches.size(); ++i) {
        setArg(i + 2, sizeof(cl_mem), &branches[i]);
    }
}